

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O1

void __thiscall kratos::Context::add_hash(Context *this,Generator *generator,uint64_t hash)

{
  _Hash_node_base *p_Var1;
  mapped_type *pmVar2;
  InternalException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  string_view format_str;
  format_args args;
  pointer local_58;
  size_type sStack_50;
  string local_40;
  Generator *local_20;
  Generator *generator_local;
  
  aVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
           )(this->generator_hash_)._M_h._M_bucket_count;
  p_Var4 = (this->generator_hash_)._M_h._M_buckets[(ulong)generator % (ulong)aVar3.values_];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var4->_M_nxt, p_Var5 = p_Var4, (Generator *)p_Var4->_M_nxt[1]._M_nxt != generator))
  {
    while (p_Var4 = p_Var1, p_Var1 = p_Var4->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var1[1]._M_nxt % (ulong)aVar3.values_ != (ulong)generator % (ulong)aVar3.values_
          ) || (p_Var5 = p_Var4, (Generator *)p_Var1[1]._M_nxt == generator)) goto LAB_001b4838;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_001b4838:
  local_20 = generator;
  if ((p_Var5 != (__node_base_ptr)0x0) && (p_Var5->_M_nxt != (_Hash_node_base *)0x0)) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_58 = (local_20->name)._M_dataplus._M_p;
    sStack_50 = (local_20->name)._M_string_length;
    format_str.size_ = 0xd;
    format_str.data_ = (char *)0x24;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar3.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_58;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_40,(detail *)"{0}\'s hash has already been computed",format_str,args);
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  pmVar2 = std::__detail::
           _Map_base<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->generator_hash_,&local_20);
  *pmVar2 = hash;
  return;
}

Assistant:

void Context::add_hash(const Generator *generator, uint64_t hash) {
    if (generator_hash_.find(generator) != generator_hash_.end())
        throw InternalException(::format("{0}'s hash has already been computed", generator->name));
    generator_hash_[generator] = hash;
}